

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform *
ON_Xform::ScaleTransformation
          (ON_Xform *__return_storage_ptr__,ON_3dPoint *fixed_point,double x_scale_factor,
          double y_scale_factor,double z_scale_factor)

{
  ON_Xform local_258;
  undefined1 local_1d8 [8];
  ON_Xform t1;
  undefined1 local_140 [8];
  ON_Xform t0;
  ON_3dVector delta;
  ON_Xform s;
  double z_scale_factor_local;
  double y_scale_factor_local;
  double x_scale_factor_local;
  ON_3dPoint *fixed_point_local;
  
  DiagonalTransformation((ON_Xform *)&delta.z,x_scale_factor,y_scale_factor,z_scale_factor);
  if ((((fixed_point->x != 0.0) || (NAN(fixed_point->x))) || (fixed_point->y != 0.0)) ||
     (((NAN(fixed_point->y) || (fixed_point->z != 0.0)) || (NAN(fixed_point->z))))) {
    ON_3dPoint::operator-((ON_3dVector *)(t0.m_xform[3] + 3),fixed_point,&ON_3dPoint::Origin);
    ON_3dVector::operator-((ON_3dVector *)(t1.m_xform[3] + 3),(ON_3dVector *)(t0.m_xform[3] + 3));
    TranslationTransformation((ON_Xform *)local_140,(ON_3dVector *)(t1.m_xform[3] + 3));
    TranslationTransformation((ON_Xform *)local_1d8,(ON_3dVector *)(t0.m_xform[3] + 3));
    operator*(&local_258,(ON_Xform *)local_1d8,(ON_Xform *)&delta.z);
    operator*(__return_storage_ptr__,&local_258,(ON_Xform *)local_140);
  }
  else {
    memcpy(__return_storage_ptr__,&delta.z,0x80);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::ScaleTransformation(
  const ON_3dPoint& fixed_point,
  double x_scale_factor,
  double y_scale_factor,
  double z_scale_factor
)
{
  const ON_Xform s(ON_Xform::DiagonalTransformation(x_scale_factor, y_scale_factor, z_scale_factor));
  if ( fixed_point.x == 0.0 && fixed_point.y == 0.0 && fixed_point.z == 0.0 )
  {
    return s;
  }

  const ON_3dVector delta = fixed_point - ON_3dPoint::Origin;
  ON_Xform t0(ON_Xform::TranslationTransformation(-delta));
  ON_Xform t1(ON_Xform::TranslationTransformation(delta));
  return (t1*s*t0);
}